

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_line.c
# Opt level: O1

int dwarf_srclines_comp_dir
              (Dwarf_Line_Context line_context,char **compilation_directory,Dwarf_Error *error)

{
  int iVar1;
  
  if ((line_context == (Dwarf_Line_Context)0x0) || (line_context->lc_magic != 0xd00d1111)) {
    _dwarf_error((Dwarf_Debug)0x0,error,0x131);
    iVar1 = 1;
  }
  else {
    *compilation_directory = (char *)line_context->lc_compilation_directory;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int
dwarf_srclines_comp_dir(Dwarf_Line_Context line_context,
    const char **  compilation_directory,
    Dwarf_Error  *  error)
{
    if (!line_context ){
        _dwarf_error(NULL, error, DW_DLE_LINE_CONTEXT_BOTCH);
        return DW_DLV_ERROR;
    }
    if (line_context->lc_magic != DW_CONTEXT_MAGIC) {
        _dwarf_error(NULL, error,
            DW_DLE_LINE_CONTEXT_BOTCH);
        return DW_DLV_ERROR;
    }
    *compilation_directory =
        (const char *)line_context->lc_compilation_directory;
    return DW_DLV_OK;
}